

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::CompressionParameters> *
kj::_::tryExtractParameters
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,
          Vector<kj::ArrayPtr<const_char>_> *configuration,bool isAgreement)

{
  Array<kj::_::KeyMaybeVal> *__return_storage_ptr___00;
  Vector<kj::ArrayPtr<const_char>_> *this;
  size_t sVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 t;
  UnverifiedConfig *config;
  NullableValue<kj::CompressionParameters> *other;
  CompressionParameters *pCVar2;
  CompressionParameters *pCVar3;
  CompressionParameters *validConfig;
  undefined1 local_108 [8];
  NullableValue<kj::CompressionParameters> _validConfig5067;
  UnverifiedConfig *unverified;
  UnverifiedConfig *_unverified5063;
  Maybe<kj::_::UnverifiedConfig> maybeUnverified;
  Array<kj::_::KeyMaybeVal> keyMaybeValuePairs;
  ArrayPtr<kj::ArrayPtr<const_char>_> params;
  CompressionParameters local_48;
  byte local_19;
  Vector<kj::ArrayPtr<const_char>_> *pVStack_18;
  bool isAgreement_local;
  Vector<kj::ArrayPtr<const_char>_> *configuration_local;
  
  local_19 = isAgreement;
  pVStack_18 = configuration;
  configuration_local = (Vector<kj::ArrayPtr<const_char>_> *)__return_storage_ptr__;
  sVar1 = Vector<kj::ArrayPtr<const_char>_>::size(configuration);
  this = pVStack_18;
  if (sVar1 == 1) {
    local_48.outboundNoContextTakeover = false;
    local_48.inboundNoContextTakeover = false;
    Maybe<unsigned_long>::Maybe();
    Maybe<unsigned_long>::Maybe(&local_48.inboundMaxWindowBits);
    Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__,&local_48);
    CompressionParameters::~CompressionParameters(&local_48);
    return __return_storage_ptr__;
  }
  sVar1 = Vector<kj::ArrayPtr<const_char>_>::size(pVStack_18);
  join_0x00000010_0x00000000_ = Vector<kj::ArrayPtr<const_char>_>::slice(this,1,sVar1);
  __return_storage_ptr___00 =
       (Array<kj::_::KeyMaybeVal> *)
       ((long)&maybeUnverified.ptr.field_1.value.serverMaxWindowBits.ptr.field_1 + 8);
  toKeysAndVals(__return_storage_ptr___00,
                (ArrayPtr<kj::ArrayPtr<const_char>_> *)&keyMaybeValuePairs.disposer);
  populateUnverifiedConfig
            ((Maybe<kj::_::UnverifiedConfig> *)&_unverified5063,__return_storage_ptr___00);
  t = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
      readMaybe<kj::_::UnverifiedConfig>((Maybe<kj::_::UnverifiedConfig> *)&_unverified5063);
  if ((UnverifiedConfig *)t.value != (UnverifiedConfig *)0x0) {
    _validConfig5067.field_1.value.inboundMaxWindowBits.ptr.field_1 = t;
    config = mv<kj::_::UnverifiedConfig>((UnverifiedConfig *)t);
    validateCompressionConfig
              ((Maybe<kj::CompressionParameters> *)&validConfig,config,(bool)(local_19 & 1));
    other = readMaybe<kj::CompressionParameters>((Maybe<kj::CompressionParameters> *)&validConfig);
    NullableValue<kj::CompressionParameters>::NullableValue
              ((NullableValue<kj::CompressionParameters> *)local_108,other);
    Maybe<kj::CompressionParameters>::~Maybe((Maybe<kj::CompressionParameters> *)&validConfig);
    pCVar2 = NullableValue::operator_cast_to_CompressionParameters_((NullableValue *)local_108);
    if (pCVar2 != (CompressionParameters *)0x0) {
      pCVar3 = NullableValue<kj::CompressionParameters>::operator*
                         ((NullableValue<kj::CompressionParameters> *)local_108);
      pCVar3 = mv<kj::CompressionParameters>(pCVar3);
      Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__,pCVar3);
    }
    NullableValue<kj::CompressionParameters>::~NullableValue
              ((NullableValue<kj::CompressionParameters> *)local_108);
    if (pCVar2 != (CompressionParameters *)0x0) goto LAB_007f3e86;
  }
  Maybe<kj::CompressionParameters>::Maybe(__return_storage_ptr__);
LAB_007f3e86:
  Maybe<kj::_::UnverifiedConfig>::~Maybe((Maybe<kj::_::UnverifiedConfig> *)&_unverified5063);
  Array<kj::_::KeyMaybeVal>::~Array
            ((Array<kj::_::KeyMaybeVal> *)
             ((long)&maybeUnverified.ptr.field_1.value.serverMaxWindowBits.ptr.field_1 + 8));
  return __return_storage_ptr__;
}

Assistant:

inline kj::Maybe<CompressionParameters> tryExtractParameters(
    kj::Vector<kj::ArrayPtr<const char>>& configuration,
    bool isAgreement) {
  // If the `configuration` is structured correctly and has no invalid parameters/values, we will
  // return a populated `CompressionParameters` struct.
  if (configuration.size() == 1) {
    // Plain `permessage-deflate`.
    return CompressionParameters{};
  }
  auto params = configuration.slice(1, configuration.size());
  auto keyMaybeValuePairs = toKeysAndVals(params);
  // Parse parameter strings into parameter[=value] pairs.
  auto maybeUnverified = populateUnverifiedConfig(keyMaybeValuePairs);
  KJ_IF_SOME(unverified, maybeUnverified) {
    // Parsing succeeded, i.e. the parameter (`key`) names are valid and we don't have
    // values for `x_no_context_takeover` parameters (the configuration is structured correctly).
    // All that's left is to check the `x_max_window_bits` values (if any are present).
    KJ_IF_SOME(validConfig, validateCompressionConfig(kj::mv(unverified), isAgreement)) {
      return kj::mv(validConfig);
    }
  }
  return kj::none;
}